

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

MethodText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeMethodText
          (MethodText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr interfaceName,
          Method method,TemplateContext *templateContext)

{
  StringTree *__return_storage_ptr___00;
  uint uVar1;
  undefined8 uVar2;
  WirePointer *pWVar3;
  undefined8 uVar4;
  CppTypeName *pCVar5;
  RemoveConst<capnp::(anonymous_namespace)::CppTypeName> *pRVar6;
  ArrayDisposer *pAVar7;
  MethodText *__return_storage_ptr___01;
  MethodText *pMVar8;
  TemplateContext *pTVar9;
  size_t sVar10;
  Branch *pBVar11;
  size_t sVar12;
  undefined4 uVar13;
  int iVar14;
  const_iterator cVar15;
  ulong uVar16;
  String *params_1;
  Schema params;
  CppTypeName *pCVar17;
  CppTypeName *pCVar18;
  CppTypeName *extraout_RDX;
  CppTypeName *extraout_RDX_00;
  CppTypeName *extraout_RDX_01;
  CppTypeName *extraout_RDX_02;
  CppTypeName *extraout_RDX_03;
  CppTypeName *extraout_RDX_04;
  CppTypeName *extraout_RDX_06;
  CppTypeName *extraout_RDX_07;
  CppTypeName *extraout_RDX_08;
  CppTypeName *extraout_RDX_09;
  CppTypeName *extraout_RDX_10;
  CppTypeName *value;
  CppTypeName *value_00;
  CppTypeName *value_01;
  CppTypeName *value_02;
  CppTypeName *value_03;
  CppTypeName *value_04;
  CppTypeName *extraout_RDX_11;
  CppTypeName *extraout_RDX_12;
  CppTypeName *extraout_RDX_13;
  CppTypeName *extraout_RDX_14;
  CppTypeName *extraout_RDX_15;
  CppTypeName *extraout_RDX_16;
  CppTypeName *value_05;
  CapTableReader *pCVar19;
  CppTypeName *pCVar20;
  char *pcVar21;
  int iVar22;
  unsigned_long i;
  char (*params_2) [3];
  char (*pacVar23) [3];
  ElementCount index;
  char *pcVar24;
  SegmentReader *pSVar25;
  StringPtr innerName;
  StringPtr innerName_00;
  StringPtr innerName_01;
  StringPtr innerName_02;
  StringPtr innerName_03;
  StringPtr innerName_04;
  initializer_list<kj::StringPtr> __l;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr delim;
  ArrayPtr<capnp::(anonymous_namespace)::CppTypeName> content;
  ArrayPtr<capnp::(anonymous_namespace)::CppTypeName> content_00;
  Reader RVar26;
  ArrayPtr<const_char> *params_11;
  undefined6 uStack_b28;
  uint16_t methodId;
  CapnpcCppMain *local_b20;
  CppTypeName local_b18;
  CppTypeName resultType;
  String titleCase;
  String implicitParamsTemplateDecl;
  PointerReader local_a58;
  undefined1 local_a38 [16];
  undefined1 local_a28 [32];
  ArrayBuilder<capnp::(anonymous_namespace)::CppTypeName> implicitParamsBuilder;
  ArrayPtr<const_char> local_9e8;
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  StringTree local_9b8;
  CppTypeName paramType;
  Array<capnp::(anonymous_namespace)::CppTypeName> implicitParams;
  StringTree local_918;
  StringTree *local_8e0;
  MethodText *local_8d8;
  TemplateContext *local_8d0;
  StructSchema resultSchema;
  StructSchema paramSchema;
  StringPtr name;
  CappedArray<char,_8UL> local_8a8;
  String identifierName;
  ArrayPtr<const_char> local_878;
  CppTypeName interfaceTypeName;
  StringTree local_828;
  String shortResultType;
  String shortParamType;
  ArrayPtr<const_char> local_7a8;
  undefined1 local_798 [16];
  CppTypeName genericParamType;
  CppTypeName genericResultType;
  StringPtr interfaceName_local;
  ArrayPtr<const_char> local_6c8;
  ArrayPtr<const_char> local_6b8;
  undefined1 local_6a8 [24];
  undefined8 local_690;
  ArrayPtr<const_char> local_688;
  Reader interfaceProto;
  Reader resultProto;
  Reader paramProto;
  CappedArray<char,_17UL> interfaceIdHex;
  Reader implicitParamsReader;
  StringTree requestMethodImpl;
  undefined4 local_560;
  CappedArray<char,_8UL> local_50;
  CappedArray<char,_8UL> local_40;
  CppTypeName *extraout_RDX_05;
  
  pSVar25 = method.proto._reader.segment;
  pCVar19 = method.proto._reader.capTable;
  pWVar3 = method.proto._reader.pointers;
  iVar22 = method.proto._reader.nestingLimit;
  interfaceName_local.content.size_ = interfaceName.content.size_;
  interfaceName_local.content.ptr = interfaceName.content.ptr;
  uVar16 = (ulong)method.proto._reader.dataSize;
  local_8e0 = (StringTree *)CONCAT62(local_8e0._2_6_,method.proto._reader.pointerCount);
  local_b20 = this;
  local_8d0 = templateContext;
  name = protoName<capnp::schema::Method::Reader>
                   ((CapnpcCppMain *)(ulong)method.proto._reader.pointerCount,method.proto._reader);
  name_00.content.ptr = (char *)name.content.size_;
  name_00.content.size_ = uVar16;
  toTitleCase(&titleCase,(CapnpcCppMain *)name.content.ptr,name_00);
  paramSchema = InterfaceSchema::Method::getParamType(&method);
  resultSchema = InterfaceSchema::Method::getResultType(&method);
  interfaceTypeName.name.size_._0_4_ = name.content.ptr._0_4_;
  interfaceTypeName.name.size_._4_4_ = name.content.ptr._4_4_;
  interfaceTypeName.name.text.content.ptr = (char *)name.content.size_;
  local_8d8 = __return_storage_ptr__;
  if (((anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords == '\0') &&
     (iVar14 = __cxa_guard_acquire(&(anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords),
     iVar14 != 0)) {
    requestMethodImpl.size_ = (size_t)anon_var_dwarf_82e22;
    requestMethodImpl.text.content.ptr = (char *)0x8;
    requestMethodImpl.text.content.size_ = (size_t)anon_var_dwarf_82e2d;
    requestMethodImpl.text.content.disposer = (ArrayDisposer *)0x8;
    requestMethodImpl.branches.ptr = (Branch *)0x23d51f;
    requestMethodImpl.branches.size_ = 4;
    requestMethodImpl.branches.disposer = (ArrayDisposer *)anon_var_dwarf_82e43;
    local_560._0_1_ = true;
    local_560._1_1_ = false;
    local_560._2_1_ = false;
    local_560._3_1_ = false;
    __l._M_len = 0x54;
    __l._M_array = (iterator)&requestMethodImpl;
    std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::set
              ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
               (anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords,__l,
               (less<kj::StringPtr> *)&paramType,(allocator_type *)&genericParamType);
    __cxa_atexit(std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::
                 ~set,(anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords);
  }
  cVar15 = std::
           _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
           ::find((_Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
                   *)(anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords,
                  (key_type *)&interfaceTypeName);
  if (cVar15._M_node ==
      (_Base_ptr)((anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords + 8)) {
    kj::heapString(&identifierName,
                   (char *)CONCAT44(interfaceTypeName.name.size_._4_4_,
                                    (undefined4)interfaceTypeName.name.size_),
                   (size_t)(interfaceTypeName.name.text.content.ptr + -1));
  }
  else {
    requestMethodImpl.size_ =
         CONCAT44(interfaceTypeName.name.size_._4_4_,(undefined4)interfaceTypeName.name.size_);
    requestMethodImpl.text.content.ptr = interfaceTypeName.name.text.content.ptr + -1;
    paramType.name.size_ = CONCAT71(paramType.name.size_._1_7_,0x5f);
    kj::_::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
              (&identifierName,(_ *)&requestMethodImpl,(ArrayPtr<const_char> *)&paramType,
               (FixedArray<char,_1UL> *)requestMethodImpl.text.content.ptr);
  }
  Schema::getProto(&paramProto,&paramSchema.super_Schema);
  Schema::getProto(&resultProto,&resultSchema.super_Schema);
  if ((ushort)local_8e0 < 5) {
    iVar22 = 0x7fffffff;
    pCVar19 = (CapTableReader *)0x0;
    requestMethodImpl.text.content.size_ = 0;
    pSVar25 = (SegmentReader *)0x0;
  }
  else {
    requestMethodImpl.text.content.size_ = (size_t)(pWVar3 + 4);
  }
  requestMethodImpl.text.content.disposer =
       (ArrayDisposer *)CONCAT44(requestMethodImpl.text.content.disposer._4_4_,iVar22);
  requestMethodImpl.size_ = (size_t)pSVar25;
  requestMethodImpl.text.content.ptr = (char *)pCVar19;
  _::PointerReader::getList
            (&implicitParamsReader.reader,(PointerReader *)&requestMethodImpl,INLINE_COMPOSITE,
             (word *)0x0);
  uVar16 = (ulong)implicitParamsReader.reader.elementCount;
  implicitParamsBuilder.ptr =
       (CppTypeName *)
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x40,0,uVar16,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  implicitParamsBuilder.endPtr = implicitParamsBuilder.ptr + uVar16;
  implicitParamsBuilder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  implicitParamsBuilder.pos = implicitParamsBuilder.ptr;
  if (implicitParamsReader.reader.elementCount != 0) {
    index = 0;
    pcVar24 = requestMethodImpl.text.content.ptr;
    sVar10 = requestMethodImpl.text.content.size_;
    pBVar11 = requestMethodImpl.branches.ptr;
    sVar12 = requestMethodImpl.branches.size_;
    do {
      requestMethodImpl.branches.size_ = sVar12;
      requestMethodImpl.branches.ptr = pBVar11;
      requestMethodImpl.text.content.size_ = sVar10;
      requestMethodImpl.text.content.ptr = pcVar24;
      _::ListReader::getStructElement
                ((StructReader *)&interfaceTypeName,&implicitParamsReader.reader,index);
      if (interfaceTypeName.name.branches.ptr._4_2_ == 0) {
        uVar13 = 0x7fffffff;
        pcVar24 = (char *)0x0;
        paramType.name.text.content.size_ = 0;
        paramType.name.size_ = 0;
      }
      else {
        paramType.name.size_ =
             CONCAT44(interfaceTypeName.name.size_._4_4_,(undefined4)interfaceTypeName.name.size_);
        pcVar24 = interfaceTypeName.name.text.content.ptr;
        paramType.name.text.content.size_ = (size_t)interfaceTypeName.name.text.content.disposer;
        uVar13 = (undefined4)interfaceTypeName.name.branches.size_;
      }
      paramType.name.text.content.disposer =
           (ArrayDisposer *)CONCAT44(paramType.name.text.content.disposer._4_4_,uVar13);
      paramType.name.text.content.ptr = pcVar24;
      RVar26 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&paramType,(void *)0x0,0);
      name_01.content.ptr = RVar26.super_StringPtr.content.size_;
      name_01.content.size_ = (size_t)pcVar24;
      CppTypeName::makeTemplateParam
                ((CppTypeName *)&requestMethodImpl,RVar26.super_StringPtr.content.ptr,name_01);
      ((implicitParamsBuilder.pos)->name).size_ = requestMethodImpl.size_;
      ((implicitParamsBuilder.pos)->name).text.content.ptr = requestMethodImpl.text.content.ptr;
      ((implicitParamsBuilder.pos)->name).text.content.size_ = requestMethodImpl.text.content.size_;
      ((implicitParamsBuilder.pos)->name).text.content.disposer =
           requestMethodImpl.text.content.disposer;
      requestMethodImpl.text.content.ptr = (char *)0x0;
      pcVar24 = requestMethodImpl.text.content.ptr;
      requestMethodImpl.text.content.size_ = 0;
      sVar10 = requestMethodImpl.text.content.size_;
      ((implicitParamsBuilder.pos)->name).branches.ptr = requestMethodImpl.branches.ptr;
      ((implicitParamsBuilder.pos)->name).branches.size_ = requestMethodImpl.branches.size_;
      ((implicitParamsBuilder.pos)->name).branches.disposer = requestMethodImpl.branches.disposer;
      requestMethodImpl.branches.ptr = (Branch *)0x0;
      pBVar11 = requestMethodImpl.branches.ptr;
      requestMethodImpl.branches.size_ = 0;
      sVar12 = requestMethodImpl.branches.size_;
      (implicitParamsBuilder.pos)->isArgDependent = local_560._0_1_;
      (implicitParamsBuilder.pos)->needsTypename = local_560._1_1_;
      (implicitParamsBuilder.pos)->hasInterfaces_ = local_560._2_1_;
      (implicitParamsBuilder.pos)->hasDisambiguatedTemplate_ = local_560._3_1_;
      implicitParamsBuilder.pos = implicitParamsBuilder.pos + 1;
      requestMethodImpl.branches.size_ = 0;
      requestMethodImpl.branches.ptr = (Branch *)0x0;
      requestMethodImpl.text.content.size_ = 0;
      requestMethodImpl.text.content.ptr = (char *)0x0;
      index = index + 1;
    } while (implicitParamsReader.reader.elementCount != index);
  }
  pAVar7 = implicitParamsBuilder.disposer;
  pRVar6 = implicitParamsBuilder.pos;
  pCVar5 = implicitParamsBuilder.ptr;
  pCVar20 = (CppTypeName *)((long)implicitParamsBuilder.pos - (long)implicitParamsBuilder.ptr >> 6);
  implicitParamsBuilder.ptr = (CppTypeName *)0x0;
  implicitParamsBuilder.pos = (RemoveConst<capnp::(anonymous_namespace)::CppTypeName> *)0x0;
  implicitParamsBuilder.endPtr = (CppTypeName *)0x0;
  implicitParamsTemplateDecl.content.disposer = (ArrayDisposer *)0x0;
  implicitParamsTemplateDecl.content.ptr = (char *)0x0;
  implicitParamsTemplateDecl.content.size_ = 0;
  if (pRVar6 != pCVar5) {
    params_2 = (char (*) [3])0x0;
    paramType.name.size_ =
         (size_t)kj::_::HeapArrayDisposer::allocateImpl
                           (0x38,0,(size_t)pCVar20,(_func_void_void_ptr *)0x0,
                            (_func_void_void_ptr *)0x0);
    paramType.name.text.content.size_ = paramType.name.size_ + (long)pCVar20 * 0x38;
    paramType.name.text.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    params_1 = (String *)paramType.name.text.content.size_;
    pCVar18 = extraout_RDX;
    pCVar17 = pCVar5;
    paramType.name.text.content.ptr = (char *)paramType.name.size_;
    pcVar24 = requestMethodImpl.text.content.ptr;
    sVar10 = requestMethodImpl.text.content.size_;
    pBVar11 = requestMethodImpl.branches.ptr;
    sVar12 = requestMethodImpl.branches.size_;
    do {
      requestMethodImpl.branches.size_ = sVar12;
      requestMethodImpl.branches.ptr = pBVar11;
      requestMethodImpl.text.content.size_ = sVar10;
      requestMethodImpl.text.content.ptr = pcVar24;
      local_b18.name.size_ = 0x22b906;
      local_b18.name.text.content.ptr = (char *)0x9;
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)&genericParamType,(kj *)pCVar17,pCVar18);
      kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::String>
                (&requestMethodImpl,&local_b18.name,(ArrayPtr<const_char> *)&genericParamType,
                 params_1);
      pacVar23 = (char (*) [3])genericParamType.name.text.content.ptr;
      sVar10 = genericParamType.name.size_;
      pCVar18 = extraout_RDX_00;
      if (genericParamType.name.size_ != 0) {
        genericParamType.name.size_ = 0;
        genericParamType.name.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)genericParamType.name.text.content.size_)
                  (genericParamType.name.text.content.size_,sVar10,1,pacVar23,pacVar23,0);
        pCVar18 = extraout_RDX_01;
        params_2 = pacVar23;
      }
      *(size_t *)paramType.name.text.content.ptr = requestMethodImpl.size_;
      *(char **)(paramType.name.text.content.ptr + 8) = requestMethodImpl.text.content.ptr;
      *(size_t *)(paramType.name.text.content.ptr + 0x10) = requestMethodImpl.text.content.size_;
      *(ArrayDisposer **)(paramType.name.text.content.ptr + 0x18) =
           requestMethodImpl.text.content.disposer;
      requestMethodImpl.text.content.ptr = (char *)0x0;
      pcVar24 = requestMethodImpl.text.content.ptr;
      requestMethodImpl.text.content.size_ = 0;
      sVar10 = requestMethodImpl.text.content.size_;
      *(Branch **)(paramType.name.text.content.ptr + 0x20) = requestMethodImpl.branches.ptr;
      *(size_t *)(paramType.name.text.content.ptr + 0x28) = requestMethodImpl.branches.size_;
      *(ArrayDisposer **)(paramType.name.text.content.ptr + 0x30) =
           requestMethodImpl.branches.disposer;
      requestMethodImpl.branches.ptr = (Branch *)0x0;
      pBVar11 = requestMethodImpl.branches.ptr;
      requestMethodImpl.branches.size_ = 0;
      sVar12 = requestMethodImpl.branches.size_;
      paramType.name.text.content.ptr = paramType.name.text.content.ptr + 0x38;
      requestMethodImpl.branches.size_ = 0;
      requestMethodImpl.branches.ptr = (Branch *)0x0;
      requestMethodImpl.text.content.size_ = 0;
      requestMethodImpl.text.content.ptr = (char *)0x0;
      pCVar17 = pCVar17 + 1;
      params_1 = (String *)requestMethodImpl.branches.disposer;
    } while (pCVar17 != pRVar6);
    genericResultType.name.text.content.ptr =
         (char *)(((long)((long)paramType.name.text.content.ptr - paramType.name.size_) >> 3) *
                 0x6db6db6db6db6db7);
    genericResultType.name.size_ = paramType.name.size_;
    genericResultType.name.text.content.size_ = (size_t)paramType.name.text.content.disposer;
    delim.content.size_ = 3;
    delim.content.ptr = ", ";
    kj::StringTree::StringTree
              (&interfaceTypeName.name,(Array<kj::StringTree> *)&genericResultType,delim);
    kj::str<char_const(&)[11],kj::StringTree,char_const(&)[3]>
              ((String *)&resultType,(kj *)"template <",(char (*) [11])&interfaceTypeName,
               (StringTree *)0x229a41,params_2);
    sVar10 = interfaceTypeName.name.branches.size_;
    pBVar11 = interfaceTypeName.name.branches.ptr;
    implicitParamsTemplateDecl.content.ptr = (char *)resultType.name.size_;
    implicitParamsTemplateDecl.content.size_ = (size_t)resultType.name.text.content.ptr;
    implicitParamsTemplateDecl.content.disposer =
         (ArrayDisposer *)resultType.name.text.content.size_;
    resultType.name.size_ = 0;
    resultType.name.text.content.ptr = (char *)0x0;
    if (interfaceTypeName.name.branches.ptr != (Branch *)0x0) {
      interfaceTypeName.name.branches.ptr = (Branch *)0x0;
      interfaceTypeName.name.branches.size_ = 0;
      (**(interfaceTypeName.name.branches.disposer)->_vptr_ArrayDisposer)
                (interfaceTypeName.name.branches.disposer,pBVar11,0x40,sVar10,sVar10,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar10 = interfaceTypeName.name.text.content.size_;
    pcVar24 = interfaceTypeName.name.text.content.ptr;
    if (interfaceTypeName.name.text.content.ptr != (char *)0x0) {
      interfaceTypeName.name.text.content.ptr = (char *)0x0;
      interfaceTypeName.name.text.content.size_ = 0;
      (**(interfaceTypeName.name.text.content.disposer)->_vptr_ArrayDisposer)
                (interfaceTypeName.name.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
    }
    pcVar24 = genericResultType.name.text.content.ptr;
    sVar10 = genericResultType.name.size_;
    if (genericResultType.name.size_ != 0) {
      genericResultType.name.size_ = 0;
      genericResultType.name.text.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)genericResultType.name.text.content.size_)
                (genericResultType.name.text.content.size_,sVar10,0x38,pcVar24,pcVar24,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
  }
  requestMethodImpl.size_ = requestMethodImpl.size_ & 0xffffffffffffff00;
  params = method.parent.super_Schema.raw;
  cppFullName(&interfaceTypeName,local_b20,method.parent.super_Schema.raw,
              method.parent.super_Schema.raw,
              (Maybe<capnp::InterfaceSchema::Method> *)&requestMethodImpl);
  paramType.name.branches.disposer._0_4_ = 0;
  paramType.name.branches.disposer._4_4_ = 0;
  paramType.isArgDependent = false;
  paramType.needsTypename = false;
  paramType.hasInterfaces_ = false;
  paramType.hasDisambiguatedTemplate_ = false;
  paramType.name.branches.ptr = (Branch *)0x0;
  paramType.name.branches.size_._0_4_ = 0;
  paramType.name.branches.size_._4_4_ = 0;
  paramType.name.text.content.size_ = 0;
  paramType.name.text.content.disposer = (ArrayDisposer *)0x0;
  paramType.name.size_ = 0;
  paramType.name.text.content.ptr = (char *)0x0;
  genericParamType.name.branches.disposer._0_4_ = 0;
  genericParamType.name.branches.disposer._4_4_ = 0;
  genericParamType.isArgDependent = false;
  genericParamType.needsTypename = false;
  genericParamType.hasInterfaces_ = false;
  genericParamType.hasDisambiguatedTemplate_ = false;
  genericParamType.name.branches.ptr = (Branch *)0x0;
  genericParamType.name.branches.size_._0_4_ = 0;
  genericParamType.name.branches.size_._4_4_ = 0;
  genericParamType.name.text.content.size_ = 0;
  genericParamType.name.text.content.disposer = (ArrayDisposer *)0x0;
  genericParamType.name.size_ = 0;
  genericParamType.name.text.content.ptr = (char *)0x0;
  if ((paramProto._reader.dataSize < 0xc0) || (*(long *)((long)paramProto._reader.data + 0x10) == 0)
     ) {
    CppTypeName::operator=(&paramType,&interfaceTypeName);
    if (pCVar20 == (CppTypeName *)0x0) {
      kj::str<kj::String&,char_const(&)[7]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Params",
                 (char (*) [7])params.raw);
      pcVar24 = (char *)requestMethodImpl.size_;
      if (requestMethodImpl.text.content.ptr == (char *)0x0) {
        pcVar24 = "";
      }
      innerName_01.content.size_ =
           requestMethodImpl.text.content.ptr + (requestMethodImpl.text.content.ptr == (char *)0x0);
      innerName_01.content.ptr = pcVar24;
      CppTypeName::addMemberType(&paramType,innerName_01);
      pCVar18 = (CppTypeName *)requestMethodImpl.text.content.ptr;
      sVar10 = requestMethodImpl.size_;
      if (requestMethodImpl.size_ != 0) {
        requestMethodImpl.size_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,sVar10,1,pCVar18,pCVar18,0);
        params.raw = (RawBrandedSchema *)pCVar18;
      }
      CppTypeName::operator=(&genericParamType,&paramType);
    }
    else {
      CppTypeName::operator=(&genericParamType,&paramType);
      kj::str<kj::String&,char_const(&)[7]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Params",
                 (char (*) [7])params.raw);
      pcVar24 = (char *)requestMethodImpl.size_;
      if (requestMethodImpl.text.content.ptr == (char *)0x0) {
        pcVar24 = "";
      }
      innerName.content.size_ =
           requestMethodImpl.text.content.ptr + (requestMethodImpl.text.content.ptr == (char *)0x0);
      pCVar18 = &resultType;
      resultType.name.size_ = 0;
      resultType.name.text.content.ptr = (char *)0x0;
      resultType.name.text.content.size_ = 0;
      innerName.content.ptr = pcVar24;
      CppTypeName::addMemberTemplate
                (&genericParamType,innerName,
                 (Array<capnp::(anonymous_namespace)::CppTypeName> *)pCVar18);
      pCVar17 = (CppTypeName *)resultType.name.text.content.ptr;
      sVar10 = resultType.name.size_;
      if (resultType.name.size_ != 0) {
        resultType.name.size_ = 0;
        resultType.name.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)resultType.name.text.content.size_)
                  (resultType.name.text.content.size_,sVar10,0x40,pCVar17,pCVar17,
                   kj::ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::
                   destruct);
        pCVar18 = pCVar17;
      }
      pCVar17 = (CppTypeName *)requestMethodImpl.text.content.ptr;
      sVar10 = requestMethodImpl.size_;
      if (requestMethodImpl.size_ != 0) {
        requestMethodImpl.size_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,sVar10,1,pCVar17,pCVar17,0);
        pCVar18 = pCVar17;
      }
      kj::str<kj::String&,char_const(&)[7]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Params",
                 (char (*) [7])pCVar18);
      pcVar21 = requestMethodImpl.text.content.ptr;
      pcVar24 = (char *)requestMethodImpl.size_;
      content.size_ = (size_t)pCVar18;
      content.ptr = pCVar20;
      kj::heapArray<capnp::(anonymous_namespace)::CppTypeName>
                ((Array<capnp::(anonymous_namespace)::CppTypeName> *)&resultType,(kj *)pCVar5,
                 content);
      innerName_00.content.size_ = pcVar21 + (pcVar21 == (char *)0x0);
      if (pcVar21 == (char *)0x0) {
        pcVar24 = "";
      }
      params.raw = (RawBrandedSchema *)&resultType;
      innerName_00.content.ptr = pcVar24;
      CppTypeName::addMemberTemplate
                (&paramType,innerName_00,
                 (Array<capnp::(anonymous_namespace)::CppTypeName> *)params.raw);
      pCVar18 = (CppTypeName *)resultType.name.text.content.ptr;
      sVar10 = resultType.name.size_;
      if (resultType.name.size_ != 0) {
        resultType.name.size_ = 0;
        resultType.name.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)resultType.name.text.content.size_)
                  (resultType.name.text.content.size_,sVar10,0x40,pCVar18,pCVar18,
                   kj::ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::
                   destruct);
        params.raw = (RawBrandedSchema *)pCVar18;
      }
      pCVar18 = (CppTypeName *)requestMethodImpl.text.content.ptr;
      sVar10 = requestMethodImpl.size_;
      if (requestMethodImpl.size_ != 0) {
        requestMethodImpl.size_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,sVar10,1,pCVar18,pCVar18,0);
        params.raw = (RawBrandedSchema *)pCVar18;
      }
    }
  }
  else {
    requestMethodImpl.text.content.size_ = CONCAT62(method._10_6_,method.ordinal);
    requestMethodImpl.branches.size_ = (size_t)method.proto._reader.data;
    requestMethodImpl.branches.disposer = (ArrayDisposer *)method.proto._reader.pointers;
    requestMethodImpl.text.content.disposer = (ArrayDisposer *)method.proto._reader.segment;
    requestMethodImpl.branches.ptr = (Branch *)method.proto._reader.capTable;
    requestMethodImpl.text.content.ptr = (char *)method.parent.super_Schema.raw;
    requestMethodImpl.size_ = CONCAT71(requestMethodImpl.size_._1_7_,1);
    cppFullName(&resultType,local_b20,paramSchema.super_Schema.raw,paramSchema.super_Schema.raw,
                (Maybe<capnp::InterfaceSchema::Method> *)&requestMethodImpl);
    CppTypeName::operator=(&paramType,&resultType);
    pBVar11 = resultType.name.branches.ptr;
    if (resultType.name.branches.ptr != (Branch *)0x0) {
      uVar2 = CONCAT44(resultType.name.branches.size_._4_4_,
                       (undefined4)resultType.name.branches.size_);
      resultType.name.branches.ptr = (Branch *)0x0;
      resultType.name.branches.size_._0_4_ = 0;
      resultType.name.branches.size_._4_4_ = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(resultType.name.branches.disposer._4_4_,
                           resultType.name.branches.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(resultType.name.branches.disposer._4_4_,
                          resultType.name.branches.disposer._0_4_),pBVar11,0x40,uVar2,uVar2,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar10 = resultType.name.text.content.size_;
    pcVar24 = resultType.name.text.content.ptr;
    if (resultType.name.text.content.ptr != (char *)0x0) {
      resultType.name.text.content.ptr = (char *)0x0;
      resultType.name.text.content.size_ = 0;
      (**(resultType.name.text.content.disposer)->_vptr_ArrayDisposer)
                (resultType.name.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
    }
    requestMethodImpl.size_ = requestMethodImpl.size_ & 0xffffffffffffff00;
    params = paramSchema.super_Schema.raw;
    cppFullName(&resultType,local_b20,paramSchema.super_Schema.raw,paramSchema.super_Schema.raw,
                (Maybe<capnp::InterfaceSchema::Method> *)&requestMethodImpl);
    CppTypeName::operator=(&genericParamType,&resultType);
    pBVar11 = resultType.name.branches.ptr;
    if (resultType.name.branches.ptr != (Branch *)0x0) {
      params.raw = (RawBrandedSchema *)
                   CONCAT44(resultType.name.branches.size_._4_4_,
                            (undefined4)resultType.name.branches.size_);
      resultType.name.branches.ptr = (Branch *)0x0;
      resultType.name.branches.size_._0_4_ = 0;
      resultType.name.branches.size_._4_4_ = 0;
      (*(code *)**(undefined8 **)
                  CONCAT44(resultType.name.branches.disposer._4_4_,
                           resultType.name.branches.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(resultType.name.branches.disposer._4_4_,
                          resultType.name.branches.disposer._0_4_),pBVar11,0x40,params.raw,
                 params.raw,kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    pCVar18 = (CppTypeName *)resultType.name.text.content.size_;
    pcVar24 = resultType.name.text.content.ptr;
    if (resultType.name.text.content.ptr != (char *)0x0) {
      resultType.name.text.content.ptr = (char *)0x0;
      resultType.name.text.content.size_ = 0;
      (**(resultType.name.text.content.disposer)->_vptr_ArrayDisposer)
                (resultType.name.text.content.disposer,pcVar24,1,pCVar18,pCVar18,0);
      params.raw = (RawBrandedSchema *)pCVar18;
    }
  }
  resultType.name.branches.disposer._0_4_ = 0;
  resultType.name.branches.disposer._4_4_ = 0;
  resultType.isArgDependent = false;
  resultType.needsTypename = false;
  resultType.hasInterfaces_ = false;
  resultType.hasDisambiguatedTemplate_ = false;
  resultType.name.branches.ptr = (Branch *)0x0;
  resultType.name.branches.size_._0_4_ = 0;
  resultType.name.branches.size_._4_4_ = 0;
  resultType.name.text.content.size_ = 0;
  resultType.name.text.content.disposer = (ArrayDisposer *)0x0;
  resultType.name.size_ = 0;
  resultType.name.text.content.ptr = (char *)0x0;
  genericResultType.name.branches.disposer._0_4_ = 0;
  genericResultType.name.branches.disposer._4_4_ = 0;
  genericResultType.isArgDependent = false;
  genericResultType.needsTypename = false;
  genericResultType.hasInterfaces_ = false;
  genericResultType.hasDisambiguatedTemplate_ = false;
  genericResultType.name.branches.ptr = (Branch *)0x0;
  genericResultType.name.branches.size_._0_4_ = 0;
  genericResultType.name.branches.size_._4_4_ = 0;
  genericResultType.name.text.content.size_ = 0;
  genericResultType.name.text.content.disposer = (ArrayDisposer *)0x0;
  genericResultType.name.size_ = 0;
  genericResultType.name.text.content.ptr = (char *)0x0;
  if ((resultProto._reader.dataSize < 0xc0) ||
     (*(long *)((long)resultProto._reader.data + 0x10) == 0)) {
    CppTypeName::operator=(&resultType,&interfaceTypeName);
    if (pCVar20 == (CppTypeName *)0x0) {
      kj::str<kj::String&,char_const(&)[8]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Results",
                 (char (*) [8])params.raw);
      pcVar24 = (char *)requestMethodImpl.size_;
      if (requestMethodImpl.text.content.ptr == (char *)0x0) {
        pcVar24 = "";
      }
      innerName_04.content.size_ =
           requestMethodImpl.text.content.ptr + (requestMethodImpl.text.content.ptr == (char *)0x0);
      innerName_04.content.ptr = pcVar24;
      CppTypeName::addMemberType(&resultType,innerName_04);
      pCVar18 = (CppTypeName *)requestMethodImpl.text.content.ptr;
      sVar10 = requestMethodImpl.size_;
      if (requestMethodImpl.size_ != 0) {
        requestMethodImpl.size_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,sVar10,1,pCVar18,pCVar18,0);
        params.raw = (RawBrandedSchema *)pCVar18;
      }
      CppTypeName::operator=(&genericResultType,&resultType);
      pCVar18 = extraout_RDX_08;
    }
    else {
      CppTypeName::operator=(&genericResultType,&resultType);
      kj::str<kj::String&,char_const(&)[8]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Results",
                 (char (*) [8])params.raw);
      pcVar24 = (char *)requestMethodImpl.size_;
      if (requestMethodImpl.text.content.ptr == (char *)0x0) {
        pcVar24 = "";
      }
      innerName_02.content.size_ =
           requestMethodImpl.text.content.ptr + (requestMethodImpl.text.content.ptr == (char *)0x0);
      pCVar18 = &local_b18;
      local_b18.name.size_ = 0;
      local_b18.name.text.content.ptr = (char *)0x0;
      local_b18.name.text.content.size_ = 0;
      innerName_02.content.ptr = pcVar24;
      CppTypeName::addMemberTemplate
                (&genericResultType,innerName_02,
                 (Array<capnp::(anonymous_namespace)::CppTypeName> *)pCVar18);
      pCVar17 = (CppTypeName *)local_b18.name.text.content.ptr;
      sVar10 = local_b18.name.size_;
      if ((char *)local_b18.name.size_ != (char *)0x0) {
        local_b18.name.size_ = 0;
        local_b18.name.text.content.ptr = (char *)0x0;
        (*(code *)(((CppTypeName *)((StringTree *)local_b18.name.text.content.size_)->size_)->name).
                  size_)(local_b18.name.text.content.size_,sVar10,0x40,pCVar17,pCVar17,
                         kj::ArrayDisposer::
                         Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::destruct);
        pCVar18 = pCVar17;
      }
      pCVar17 = (CppTypeName *)requestMethodImpl.text.content.ptr;
      sVar10 = requestMethodImpl.size_;
      if (requestMethodImpl.size_ != 0) {
        requestMethodImpl.size_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,sVar10,1,pCVar17,pCVar17,0);
        pCVar18 = pCVar17;
      }
      kj::str<kj::String&,char_const(&)[8]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Results",
                 (char (*) [8])pCVar18);
      pcVar21 = requestMethodImpl.text.content.ptr;
      pcVar24 = (char *)requestMethodImpl.size_;
      content_00.size_ = (size_t)pCVar18;
      content_00.ptr = pCVar20;
      kj::heapArray<capnp::(anonymous_namespace)::CppTypeName>
                ((Array<capnp::(anonymous_namespace)::CppTypeName> *)&local_b18,(kj *)pCVar5,
                 content_00);
      innerName_03.content.size_ = pcVar21 + (pcVar21 == (char *)0x0);
      if (pcVar21 == (char *)0x0) {
        pcVar24 = "";
      }
      params.raw = (RawBrandedSchema *)&local_b18;
      innerName_03.content.ptr = pcVar24;
      CppTypeName::addMemberTemplate
                (&resultType,innerName_03,
                 (Array<capnp::(anonymous_namespace)::CppTypeName> *)params.raw);
      pCVar17 = (CppTypeName *)local_b18.name.text.content.ptr;
      sVar10 = local_b18.name.size_;
      pCVar18 = extraout_RDX_05;
      if ((char *)local_b18.name.size_ != (char *)0x0) {
        local_b18.name.size_ = 0;
        local_b18.name.text.content.ptr = (char *)0x0;
        (*(code *)(((CppTypeName *)((StringTree *)local_b18.name.text.content.size_)->size_)->name).
                  size_)(local_b18.name.text.content.size_,sVar10,0x40,pCVar17,pCVar17,
                         kj::ArrayDisposer::
                         Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::destruct);
        params.raw = (RawBrandedSchema *)pCVar17;
        pCVar18 = extraout_RDX_06;
      }
      pCVar17 = (CppTypeName *)requestMethodImpl.text.content.ptr;
      sVar10 = requestMethodImpl.size_;
      if (requestMethodImpl.size_ != 0) {
        requestMethodImpl.size_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,sVar10,1,pCVar17,pCVar17,0);
        params.raw = (RawBrandedSchema *)pCVar17;
        pCVar18 = extraout_RDX_07;
      }
    }
  }
  else {
    requestMethodImpl.text.content.size_ = CONCAT62(method._10_6_,method.ordinal);
    requestMethodImpl.branches.size_ = (size_t)method.proto._reader.data;
    requestMethodImpl.branches.disposer = (ArrayDisposer *)method.proto._reader.pointers;
    requestMethodImpl.text.content.disposer = (ArrayDisposer *)method.proto._reader.segment;
    requestMethodImpl.branches.ptr = (Branch *)method.proto._reader.capTable;
    requestMethodImpl.text.content.ptr = (char *)method.parent.super_Schema.raw;
    requestMethodImpl.size_ = CONCAT71(requestMethodImpl.size_._1_7_,1);
    cppFullName(&local_b18,local_b20,resultSchema.super_Schema.raw,resultSchema.super_Schema.raw,
                (Maybe<capnp::InterfaceSchema::Method> *)&requestMethodImpl);
    CppTypeName::operator=(&resultType,&local_b18);
    sVar10 = local_b18.name.branches.size_;
    pBVar11 = local_b18.name.branches.ptr;
    if (local_b18.name.branches.ptr != (Branch *)0x0) {
      local_b18.name.branches.ptr = (Branch *)0x0;
      local_b18.name.branches.size_ = 0;
      (**(local_b18.name.branches.disposer)->_vptr_ArrayDisposer)
                (local_b18.name.branches.disposer,pBVar11,0x40,sVar10,sVar10,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar10 = local_b18.name.text.content.size_;
    pcVar24 = local_b18.name.text.content.ptr;
    if ((CppTypeName *)local_b18.name.text.content.ptr != (CppTypeName *)0x0) {
      local_b18.name.text.content.ptr = (char *)0x0;
      local_b18.name.text.content.size_ = 0;
      (**(local_b18.name.text.content.disposer)->_vptr_ArrayDisposer)
                (local_b18.name.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
    }
    requestMethodImpl.size_ = requestMethodImpl.size_ & 0xffffffffffffff00;
    params = resultSchema.super_Schema.raw;
    cppFullName(&local_b18,local_b20,resultSchema.super_Schema.raw,resultSchema.super_Schema.raw,
                (Maybe<capnp::InterfaceSchema::Method> *)&requestMethodImpl);
    CppTypeName::operator=(&genericResultType,&local_b18);
    pCVar17 = (CppTypeName *)local_b18.name.branches.size_;
    pBVar11 = local_b18.name.branches.ptr;
    pCVar18 = extraout_RDX_02;
    if (local_b18.name.branches.ptr != (Branch *)0x0) {
      local_b18.name.branches.ptr = (Branch *)0x0;
      local_b18.name.branches.size_ = 0;
      (**(local_b18.name.branches.disposer)->_vptr_ArrayDisposer)
                (local_b18.name.branches.disposer,pBVar11,0x40,pCVar17,pCVar17,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      params.raw = (RawBrandedSchema *)pCVar17;
      pCVar18 = extraout_RDX_03;
    }
    pCVar17 = (CppTypeName *)local_b18.name.text.content.size_;
    pcVar24 = local_b18.name.text.content.ptr;
    if ((CppTypeName *)local_b18.name.text.content.ptr != (CppTypeName *)0x0) {
      local_b18.name.text.content.ptr = (char *)0x0;
      local_b18.name.text.content.size_ = 0;
      (**(local_b18.name.text.content.disposer)->_vptr_ArrayDisposer)
                (local_b18.name.text.content.disposer,pcVar24,1,pCVar17,pCVar17,0);
      params.raw = (RawBrandedSchema *)pCVar17;
      pCVar18 = extraout_RDX_04;
    }
  }
  if ((paramProto._reader.dataSize < 0xc0) || (*(long *)((long)paramProto._reader.data + 0x10) == 0)
     ) {
    kj::str<kj::String&,char_const(&)[7]>
              (&shortParamType,(kj *)&titleCase,(String *)"Params",(char (*) [7])params.raw);
    pCVar18 = extraout_RDX_10;
  }
  else {
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&requestMethodImpl,(kj *)&genericParamType,pCVar18);
    shortParamType.content.ptr = (char *)requestMethodImpl.size_;
    shortParamType.content.size_ = (size_t)requestMethodImpl.text.content.ptr;
    shortParamType.content.disposer = (ArrayDisposer *)requestMethodImpl.text.content.size_;
    pCVar18 = extraout_RDX_09;
  }
  if ((resultProto._reader.dataSize < 0xc0) ||
     (*(long *)((long)resultProto._reader.data + 0x10) == 0)) {
    kj::str<kj::String&,char_const(&)[8]>
              (&shortResultType,(kj *)&titleCase,(String *)"Results",(char (*) [8])params.raw);
  }
  else {
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&requestMethodImpl,(kj *)&genericResultType,pCVar18);
    shortResultType.content.ptr = (char *)requestMethodImpl.size_;
    shortResultType.content.size_ = (size_t)requestMethodImpl.text.content.ptr;
    shortResultType.content.disposer = (ArrayDisposer *)requestMethodImpl.text.content.size_;
  }
  requestMethodImpl.size_ = (size_t)method.parent.super_Schema.raw;
  Schema::getProto(&interfaceProto,(Schema *)&requestMethodImpl);
  if (interfaceProto._reader.dataSize < 0x40) {
    i = 0;
  }
  else {
    i = *interfaceProto._reader.data;
  }
  kj::hex(&interfaceIdHex,i);
  pTVar9 = local_8d0;
  methodId = method.ordinal;
  TemplateContext::allDecls(&local_b18.name,local_8d0);
  uVar1 = (pTVar9->node)._reader.dataSize;
  if (uVar1 < 0x121) {
    pcVar24 = "";
  }
  else {
    pcVar24 = "CAPNP_AUTO_IF_MSVC(";
    if ((*(byte *)((long)(pTVar9->node)._reader.data + 0x24) & 1) == 0) {
      pcVar24 = "";
    }
  }
  if (uVar1 < 0x121) {
    pcVar21 = "\n";
  }
  else {
    pcVar21 = ")\n";
    if ((*(byte *)((long)(pTVar9->node)._reader.data + 0x24) & 1) == 0) {
      pcVar21 = "\n";
    }
  }
  local_a28._0_8_ = implicitParamsTemplateDecl.content.size_;
  if (implicitParamsTemplateDecl.content.size_ != 0) {
    local_a28._0_8_ = implicitParamsTemplateDecl.content.ptr;
  }
  local_a28._8_8_ = (ArrayDisposer *)0x0;
  if (implicitParamsTemplateDecl.content.size_ != 0) {
    local_a28._8_8_ = (ArrayDisposer *)(implicitParamsTemplateDecl.content.size_ - 1);
  }
  local_a38._8_8_ = strlen(pcVar24);
  local_9c8._8_8_ = 0x11;
  local_9c8._0_8_ = "::capnp::Request<";
  local_a38._0_8_ = pcVar24;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_918,(kj *)&paramType,value);
  local_8a8.currentSize = 0x22b13e;
  local_8a8.content[0] = '\x02';
  local_8a8.content[1] = '\0';
  local_8a8.content[2] = '\0';
  local_8a8.content[3] = '\0';
  local_8a8.content[4] = '\0';
  local_8a8.content[5] = '\0';
  local_8a8.content[6] = '\0';
  local_8a8.content[7] = '\0';
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)(local_9c8 + 0x10),(kj *)&resultType,value_00);
  local_9d8._0_8_ = ">";
  local_9d8._8_8_ = 1;
  local_9e8.size_ = strlen(pcVar21);
  local_878.size_ = interfaceName_local.content.size_ - 1;
  local_878.ptr = interfaceName_local.content.ptr;
  local_798._0_8_ = "::Client::";
  local_798._8_8_ = 10;
  local_7a8.size_ = name.content.size_ - 1;
  local_7a8.ptr = name.content.ptr;
  local_688.ptr = "Request(::kj::Maybe< ::capnp::MessageSize> sizeHint) {\n  return newCall<";
  local_688.size_ = 0x48;
  local_9e8.ptr = pcVar21;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_828,(kj *)&paramType,value_01);
  local_6a8._16_8_ = ", ";
  local_690 = 2;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_a58,(kj *)&resultType,value_02);
  local_6a8._0_8_ = ">(\n      0x";
  local_6a8._8_8_ = 0xb;
  local_6b8.ptr = interfaceIdHex.content;
  local_6b8.size_ = interfaceIdHex.currentSize;
  local_6c8.ptr = "ull, ";
  local_6c8.size_ = 5;
  local_40 = kj::_::Stringifier::operator*((Stringifier *)&kj::_::STR,methodId);
  local_50.currentSize = 0x22ca52;
  local_50.content[0] = '\x0f';
  local_50.content[1] = '\0';
  local_50.content[2] = '\0';
  local_50.content[3] = '\0';
  local_50.content[4] = '\0';
  local_50.content[5] = '\0';
  local_50.content[6] = '\0';
  local_50.content[7] = '\0';
  kj::StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (&requestMethodImpl,&local_b18.name,(StringTree *)local_a28,
             (ArrayPtr<const_char> *)local_a38,(ArrayPtr<const_char> *)local_9c8,
             (ArrayPtr<const_char> *)&local_918,(String *)&local_8a8,
             (ArrayPtr<const_char> *)(local_9c8 + 0x10),(String *)local_9d8,&local_9e8,&local_878,
             (ArrayPtr<const_char> *)local_798,&local_7a8,&local_688,
             (ArrayPtr<const_char> *)&local_828,(String *)(local_6a8 + 0x10),
             (ArrayPtr<const_char> *)&local_a58,(String *)local_6a8,&local_6b8,&local_6c8,
             (ArrayPtr<const_char> *)&local_40,&local_50,
             (ArrayPtr<const_char> *)CONCAT26(methodId,uStack_b28));
  __return_storage_ptr___01 = local_8d8;
  pCVar19 = local_a58.capTable;
  pSVar25 = local_a58.segment;
  if (local_a58.segment != (SegmentReader *)0x0) {
    local_a58.segment = (SegmentReader *)0x0;
    local_a58.capTable = (CapTableReader *)0x0;
    (**(code **)*local_a58.pointer)(local_a58.pointer,pSVar25,1,pCVar19,pCVar19,0);
  }
  pcVar24 = local_828.text.content.ptr;
  sVar10 = local_828.size_;
  if (local_828.size_ != 0) {
    local_828.size_ = 0;
    local_828.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_828.text.content.size_)
              (local_828.text.content.size_,sVar10,1,pcVar24,pcVar24,0);
  }
  pcVar24 = local_9b8.text.content.ptr;
  sVar10 = local_9b8.size_;
  if ((ArrayDisposer *)local_9b8.size_ != (ArrayDisposer *)0x0) {
    local_9b8.size_ = 0;
    local_9b8.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_9b8.text.content.size_)
              (local_9b8.text.content.size_,sVar10,1,pcVar24,pcVar24,0);
  }
  pcVar24 = local_918.text.content.ptr;
  sVar10 = local_918.size_;
  if (local_918.size_ != 0) {
    local_918.size_ = 0;
    local_918.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_918.text.content.size_)
              (local_918.text.content.size_,sVar10,1,pcVar24,pcVar24,0);
  }
  sVar10 = local_b18.name.branches.size_;
  pBVar11 = local_b18.name.branches.ptr;
  if (local_b18.name.branches.ptr != (Branch *)0x0) {
    local_b18.name.branches.ptr = (Branch *)0x0;
    local_b18.name.branches.size_ = 0;
    (**(local_b18.name.branches.disposer)->_vptr_ArrayDisposer)
              (local_b18.name.branches.disposer,pBVar11,0x40,sVar10,sVar10,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar10 = local_b18.name.text.content.size_;
  pcVar24 = local_b18.name.text.content.ptr;
  if ((CppTypeName *)local_b18.name.text.content.ptr != (CppTypeName *)0x0) {
    local_b18.name.text.content.ptr = (char *)0x0;
    local_b18.name.text.content.size_ = 0;
    (**(local_b18.name.text.content.disposer)->_vptr_ArrayDisposer)
              (local_b18.name.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  pcVar24 = "";
  pcVar21 = "  ";
  local_9b8.size_ = 0x229c0c;
  if (implicitParamsTemplateDecl.content.size_ < 2) {
    local_9b8.size_ = 0x22a50f;
  }
  uVar1 = (local_8d0->node)._reader.dataSize;
  if ((0x120 < uVar1) &&
     (pcVar21 = "  CAPNP_AUTO_IF_MSVC(",
     (*(byte *)((long)(local_8d0->node)._reader.data + 0x24) & 1) == 0)) {
    pcVar21 = "  ";
  }
  if ((0x120 < uVar1) &&
     (pcVar24 = ")", (*(byte *)((long)(local_8d0->node)._reader.data + 0x24) & 1) == 0)) {
    pcVar24 = "";
  }
  local_9b8.text.content.ptr =
       (char *)(ulong)((uint)(1 < implicitParamsTemplateDecl.content.size_) * 2);
  local_828.size_ = implicitParamsTemplateDecl.content.size_;
  if (implicitParamsTemplateDecl.content.size_ != 0) {
    local_828.size_ = (size_t)implicitParamsTemplateDecl.content.ptr;
  }
  local_828.text.content.ptr = (char *)0x0;
  if (implicitParamsTemplateDecl.content.size_ != 0) {
    local_828.text.content.ptr = (char *)(implicitParamsTemplateDecl.content.size_ - 1);
  }
  local_a58.capTable = (CapTableReader *)strlen(pcVar21);
  local_a28._0_8_ = "::capnp::Request<";
  local_a28._8_8_ = (ArrayDisposer *)0x11;
  local_a58.segment = (SegmentReader *)pcVar21;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_b18,(kj *)&paramType,value_03);
  local_a38._0_8_ = ", ";
  local_a38._8_8_ = (char *)0x2;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_918,(kj *)&resultType,value_04);
  local_9c8._8_8_ = 1;
  local_9c8._0_8_ = ">";
  params_11 = (ArrayPtr<const_char> *)0x17df65;
  local_8a8.content = (char  [8])strlen(pcVar24);
  local_9d8._0_8_ = " ";
  local_9d8._8_8_ = 1;
  local_9e8.size_ = name.content.size_ - 1;
  local_9e8.ptr = name.content.ptr;
  local_878.ptr = "Request(\n      ::kj::Maybe< ::capnp::MessageSize> sizeHint = nullptr);\n";
  local_878.size_ = 0x47;
  local_8a8.currentSize = (size_t)pcVar24;
  kj::StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (&__return_storage_ptr___01->clientDecls,(StringTree *)(local_9c8 + 0x10),
             (ArrayPtr<const_char> *)&local_828,(ArrayPtr<const_char> *)&local_a58,
             (ArrayPtr<const_char> *)local_a28,(ArrayPtr<const_char> *)&local_b18,
             (String *)local_a38,(ArrayPtr<const_char> *)&local_918,(String *)local_9c8,
             (ArrayPtr<const_char> *)&local_8a8,(ArrayPtr<const_char> *)local_9d8,&local_9e8,
             &local_878,params_11);
  pcVar24 = local_918.text.content.ptr;
  sVar10 = local_918.size_;
  pCVar18 = extraout_RDX_11;
  if (local_918.size_ != 0) {
    local_918.size_ = 0;
    local_918.text.content.ptr = (char *)0x0;
    (*(code *)**(undefined8 **)local_918.text.content.size_)
              (local_918.text.content.size_,sVar10,1,pcVar24,pcVar24,0);
    pCVar18 = extraout_RDX_12;
  }
  pcVar24 = local_b18.name.text.content.ptr;
  sVar10 = local_b18.name.size_;
  if ((char *)local_b18.name.size_ != (char *)0x0) {
    local_b18.name.size_ = 0;
    local_b18.name.text.content.ptr = (char *)0x0;
    (*(code *)(((CppTypeName *)((StringTree *)local_b18.name.text.content.size_)->size_)->name).
              size_)(local_b18.name.text.content.size_,sVar10,1,pcVar24,pcVar24,0);
    pCVar18 = extraout_RDX_13;
  }
  if ((paramProto._reader.dataSize < 0xc0) || (*(long *)((long)paramProto._reader.data + 0x10) == 0)
     ) {
    local_9b8.size_ = 0x22bd18;
    local_9b8.text.content.ptr = (char *)0xa;
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&local_918,(kj *)&genericParamType,pCVar18);
    local_828.size_ = 0x229c0d;
    local_828.text.content.ptr = (char *)0x1;
    local_a58.segment = (SegmentReader *)titleCase.content.size_;
    if (titleCase.content.size_ != 0) {
      local_a58.segment = (SegmentReader *)titleCase.content.ptr;
    }
    local_a58.capTable = (CapTableReader *)0x0;
    if (titleCase.content.size_ != 0) {
      local_a58.capTable = (CapTableReader *)(titleCase.content.size_ - 1);
    }
    local_a28._0_8_ = "Params;\n";
    local_a28._8_8_ = (ArrayDisposer *)0x8;
    kj::StringTree::
    concat<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_b18.name,(StringTree *)(local_9c8 + 0x10),(ArrayPtr<const_char> *)&local_918,
               (String *)&local_828,(ArrayPtr<const_char> *)&local_a58,
               (ArrayPtr<const_char> *)local_a28,
               (ArrayPtr<const_char> *)CONCAT26(methodId,uStack_b28));
    pcVar24 = local_918.text.content.ptr;
    sVar10 = local_918.size_;
    pCVar18 = extraout_RDX_15;
    if (local_918.size_ != 0) {
      local_918.size_ = 0;
      local_918.text.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)local_918.text.content.size_)
                (local_918.text.content.size_,sVar10,1,pcVar24,pcVar24,0);
      pCVar18 = extraout_RDX_16;
    }
  }
  else {
    kj::StringTree::concat<>();
    pCVar18 = extraout_RDX_14;
  }
  if ((resultProto._reader.dataSize < 0xc0) ||
     (*(long *)((long)resultProto._reader.data + 0x10) == 0)) {
    local_828.size_ = 0x22bd18;
    local_828.text.content.ptr = (char *)0xa;
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)(local_9c8 + 0x10),(kj *)&genericResultType,pCVar18);
    local_a58.segment = (SegmentReader *)0x229c0d;
    local_a58.capTable = (CapTableReader *)0x1;
    local_a28._0_8_ = titleCase.content.size_;
    if (titleCase.content.size_ != 0) {
      local_a28._0_8_ = titleCase.content.ptr;
    }
    local_a28._8_8_ = (ArrayDisposer *)0x0;
    if (titleCase.content.size_ != 0) {
      local_a28._8_8_ = (ArrayDisposer *)(titleCase.content.size_ - 1);
    }
    local_a38._0_8_ = "Results;\n";
    local_a38._8_8_ = (char *)0x9;
    kj::StringTree::
    concat<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_918,&local_828,(ArrayPtr<const_char> *)(local_9c8 + 0x10),(String *)&local_a58
               ,(ArrayPtr<const_char> *)local_a28,(ArrayPtr<const_char> *)local_a38,
               (ArrayPtr<const_char> *)CONCAT26(methodId,uStack_b28));
    pcVar24 = local_9b8.text.content.ptr;
    sVar10 = local_9b8.size_;
    if ((ArrayDisposer *)local_9b8.size_ != (ArrayDisposer *)0x0) {
      local_9b8.size_ = 0;
      local_9b8.text.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)local_9b8.text.content.size_)
                (local_9b8.text.content.size_,sVar10,1,pcVar24,pcVar24,0);
    }
  }
  else {
    kj::StringTree::concat<>();
  }
  __return_storage_ptr___00 = &__return_storage_ptr___01->serverDecls;
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[32],kj::String&,char_const(&)[3],kj::String&,char_const(&)[3],kj::String&,char_const(&)[40],kj::String&,char_const(&)[2],kj::String&,char_const(&)[19]>
            (__return_storage_ptr___00,(kj *)&local_b18,&local_918,
             (StringTree *)"  typedef ::capnp::CallContext<",(char (*) [32])&shortParamType,
             (String *)0x22b13e,(char (*) [3])&shortResultType,(String *)0x22aeb9,
             (char (*) [3])&titleCase,(String *)"Context;\n  virtual ::kj::Promise<void> ",
             (char (*) [40])&identifierName,(String *)0x22cfad,(char (*) [2])&titleCase,
             (String *)"Context context);\n",(char (*) [19])CONCAT26(methodId,uStack_b28));
  local_b20 = (CapnpcCppMain *)__return_storage_ptr___00;
  if (pCVar20 == (CppTypeName *)0x0) {
    kj::StringTree::concat<>();
    local_9b8.size_ = requestMethodImpl.size_;
    local_9b8.text.content.ptr = requestMethodImpl.text.content.ptr;
    local_9b8.text.content.size_ = requestMethodImpl.text.content.size_;
    local_9b8.text.content.disposer = requestMethodImpl.text.content.disposer;
    local_9b8.branches.ptr = requestMethodImpl.branches.ptr;
    requestMethodImpl.text.content.ptr = (char *)0x0;
    requestMethodImpl.text.content.size_ = 0;
    local_9b8.branches.size_ = requestMethodImpl.branches.size_;
    local_9b8.branches.disposer = requestMethodImpl.branches.disposer;
    requestMethodImpl.branches.ptr = (Branch *)0x0;
    requestMethodImpl.branches.size_ = 0;
    local_8e0 = &__return_storage_ptr___01->inlineDefs;
  }
  else {
    (__return_storage_ptr___01->inlineDefs).size_ = requestMethodImpl.size_;
    (__return_storage_ptr___01->inlineDefs).text.content.ptr = requestMethodImpl.text.content.ptr;
    (__return_storage_ptr___01->inlineDefs).text.content.size_ =
         requestMethodImpl.text.content.size_;
    (__return_storage_ptr___01->inlineDefs).text.content.disposer =
         requestMethodImpl.text.content.disposer;
    requestMethodImpl.text.content.ptr = (char *)0x0;
    requestMethodImpl.text.content.size_ = 0;
    (__return_storage_ptr___01->inlineDefs).branches.ptr = requestMethodImpl.branches.ptr;
    (__return_storage_ptr___01->inlineDefs).branches.size_ = requestMethodImpl.branches.size_;
    (__return_storage_ptr___01->inlineDefs).branches.disposer = requestMethodImpl.branches.disposer;
    requestMethodImpl.branches.ptr = (Branch *)0x0;
    requestMethodImpl.branches.size_ = 0;
    local_8e0 = &__return_storage_ptr___01->inlineDefs;
    kj::StringTree::concat<>();
  }
  TemplateContext::allDecls(&local_828,local_8d0);
  if (interfaceProto._reader.pointerCount == 0) {
    interfaceProto._reader.nestingLimit = 0x7fffffff;
    interfaceProto._reader.capTable = (CapTableReader *)0x0;
    interfaceProto._reader.pointers = (WirePointer *)0x0;
    interfaceProto._reader.segment = (SegmentReader *)0x0;
  }
  local_a58.segment = interfaceProto._reader.segment;
  local_a58.capTable = interfaceProto._reader.capTable;
  local_a58.pointer = interfaceProto._reader.pointers;
  local_a58.nestingLimit = interfaceProto._reader.nestingLimit;
  local_7a8 = (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_a58,(void *)0x0,0)
  ;
  pMVar8 = local_8d8;
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[21],kj::StringPtr&,char_const(&)[11],kj::String&,char_const(&)[2],kj::String&,char_const(&)[80],capnp::Text::Reader,char_const(&)[5],kj::StringPtr&,char_const(&)[12],kj::CappedArray<char,17ul>&,char_const(&)[6],unsigned_short&,char_const(&)[6]>
            (&__return_storage_ptr___01->sourceDefs,(kj *)(local_9c8 + 0x10),&local_828,
             (StringTree *)0x22cb06,(char (*) [21])&interfaceName_local,(StringPtr *)"::Server::",
             (char (*) [11])&identifierName,(String *)0x22cfad,(char (*) [2])&titleCase,
             (String *)
             "Context) {\n  return ::capnp::Capability::Server::internalUnimplemented(\n      \"",
             (char (*) [80])&local_7a8,(Reader *)"\", \"",(char (*) [5])&name,
             (StringPtr *)"\",\n      0x",(char (*) [12])&interfaceIdHex,
             (CappedArray<char,_17UL> *)"ull, ",(char (*) [6])&methodId,(unsigned_short *)0x22a80f,
             (char (*) [6])CONCAT26(methodId,uStack_b28));
  local_a38._0_8_ = "    case ";
  local_a38._8_8_ = (char *)0x9;
  local_9c8 = (undefined1  [16])kj::_::Stringifier::operator*((Stringifier *)&kj::_::STR,methodId);
  local_8a8.currentSize = 0x22ce2b;
  local_8a8.content[0] = '\x0f';
  local_8a8.content[1] = '\0';
  local_8a8.content[2] = '\0';
  local_8a8.content[3] = '\0';
  local_8a8.content[4] = '\0';
  local_8a8.content[5] = '\0';
  local_8a8.content[6] = '\0';
  local_8a8.content[7] = '\0';
  local_9d8._8_8_ = (CppTypeName *)0x0;
  if (identifierName.content.size_ != 0) {
    local_9d8._8_8_ = (CppTypeName *)(identifierName.content.size_ - 1);
  }
  local_9e8.ptr = "(::capnp::Capability::Server::internalGetTypedContext<\n          ";
  local_9e8.size_ = 0x41;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_a58,(kj *)&genericParamType,(CppTypeName *)local_9d8._8_8_);
  local_878.ptr = ", ";
  local_878.size_ = 2;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)local_a28,(kj *)&genericResultType,value_05);
  local_798._0_8_ = ">(context));\n";
  local_798._8_8_ = 0xd;
  kj::StringTree::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
            (&pMVar8->dispatchCase,(StringTree *)local_a38,(ArrayPtr<const_char> *)local_9c8,
             &local_8a8,(ArrayPtr<const_char> *)local_9d8,&local_9e8,
             (ArrayPtr<const_char> *)&local_a58,(String *)&local_878,
             (ArrayPtr<const_char> *)local_a28,(String *)local_798,
             (ArrayPtr<const_char> *)CONCAT26(methodId,uStack_b28));
  uVar4 = local_a28._8_8_;
  uVar2 = local_a28._0_8_;
  if ((ArrayDisposer *)local_a28._0_8_ != (ArrayDisposer *)0x0) {
    local_a28._0_8_ = (ArrayDisposer *)0x0;
    local_a28._8_8_ = (ArrayDisposer *)0x0;
    (**(code **)*(size_t *)local_a28._16_8_)(local_a28._16_8_,uVar2,1,uVar4,uVar4,0);
  }
  pCVar19 = local_a58.capTable;
  pSVar25 = local_a58.segment;
  if (local_a58.segment != (SegmentReader *)0x0) {
    local_a58.segment = (SegmentReader *)0x0;
    local_a58.capTable = (CapTableReader *)0x0;
    (**(code **)*local_a58.pointer)(local_a58.pointer,pSVar25,1,pCVar19,pCVar19,0);
  }
  sVar10 = local_828.branches.size_;
  pBVar11 = local_828.branches.ptr;
  if (local_828.branches.ptr != (Branch *)0x0) {
    local_828.branches.ptr = (Branch *)0x0;
    local_828.branches.size_ = 0;
    (**(local_828.branches.disposer)->_vptr_ArrayDisposer)
              (local_828.branches.disposer,pBVar11,0x40,sVar10,sVar10,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar10 = local_828.text.content.size_;
  pcVar24 = local_828.text.content.ptr;
  if (local_828.text.content.ptr != (char *)0x0) {
    local_828.text.content.ptr = (char *)0x0;
    local_828.text.content.size_ = 0;
    (**(local_828.text.content.disposer)->_vptr_ArrayDisposer)
              (local_828.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  sVar10 = local_9b8.branches.size_;
  pBVar11 = local_9b8.branches.ptr;
  if (local_9b8.branches.ptr != (Branch *)0x0) {
    local_9b8.branches.ptr = (Branch *)0x0;
    local_9b8.branches.size_ = 0;
    (**(local_9b8.branches.disposer)->_vptr_ArrayDisposer)
              (local_9b8.branches.disposer,pBVar11,0x40,sVar10,sVar10,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar10 = local_9b8.text.content.size_;
  pcVar24 = local_9b8.text.content.ptr;
  if (local_9b8.text.content.ptr != (char *)0x0) {
    local_9b8.text.content.ptr = (char *)0x0;
    local_9b8.text.content.size_ = 0;
    (**(local_9b8.text.content.disposer)->_vptr_ArrayDisposer)
              (local_9b8.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  sVar10 = local_918.branches.size_;
  pBVar11 = local_918.branches.ptr;
  if (local_918.branches.ptr != (Branch *)0x0) {
    local_918.branches.ptr = (Branch *)0x0;
    local_918.branches.size_ = 0;
    (**(local_918.branches.disposer)->_vptr_ArrayDisposer)
              (local_918.branches.disposer,pBVar11,0x40,sVar10,sVar10,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar10 = local_918.text.content.size_;
  pcVar24 = local_918.text.content.ptr;
  if (local_918.text.content.ptr != (char *)0x0) {
    local_918.text.content.ptr = (char *)0x0;
    local_918.text.content.size_ = 0;
    (**(local_918.text.content.disposer)->_vptr_ArrayDisposer)
              (local_918.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  sVar10 = local_b18.name.branches.size_;
  pBVar11 = local_b18.name.branches.ptr;
  if (local_b18.name.branches.ptr != (Branch *)0x0) {
    local_b18.name.branches.ptr = (Branch *)0x0;
    local_b18.name.branches.size_ = 0;
    (**(local_b18.name.branches.disposer)->_vptr_ArrayDisposer)
              (local_b18.name.branches.disposer,pBVar11,0x40,sVar10,sVar10,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar10 = local_b18.name.text.content.size_;
  pcVar24 = local_b18.name.text.content.ptr;
  if ((CppTypeName *)local_b18.name.text.content.ptr != (CppTypeName *)0x0) {
    local_b18.name.text.content.ptr = (char *)0x0;
    local_b18.name.text.content.size_ = 0;
    (**(local_b18.name.text.content.disposer)->_vptr_ArrayDisposer)
              (local_b18.name.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  sVar10 = requestMethodImpl.branches.size_;
  pBVar11 = requestMethodImpl.branches.ptr;
  if (requestMethodImpl.branches.ptr != (Branch *)0x0) {
    requestMethodImpl.branches.ptr = (Branch *)0x0;
    requestMethodImpl.branches.size_ = 0;
    (**(requestMethodImpl.branches.disposer)->_vptr_ArrayDisposer)
              (requestMethodImpl.branches.disposer,pBVar11,0x40,sVar10,sVar10,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar10 = requestMethodImpl.text.content.size_;
  pcVar24 = requestMethodImpl.text.content.ptr;
  if (requestMethodImpl.text.content.ptr != (char *)0x0) {
    requestMethodImpl.text.content.ptr = (char *)0x0;
    requestMethodImpl.text.content.size_ = 0;
    (**(requestMethodImpl.text.content.disposer)->_vptr_ArrayDisposer)
              (requestMethodImpl.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  sVar10 = shortResultType.content.size_;
  pcVar24 = shortResultType.content.ptr;
  if (shortResultType.content.ptr != (char *)0x0) {
    shortResultType.content.ptr = (char *)0x0;
    shortResultType.content.size_ = 0;
    (**(shortResultType.content.disposer)->_vptr_ArrayDisposer)
              (shortResultType.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  sVar10 = shortParamType.content.size_;
  pcVar24 = shortParamType.content.ptr;
  if (shortParamType.content.ptr != (char *)0x0) {
    shortParamType.content.ptr = (char *)0x0;
    shortParamType.content.size_ = 0;
    (**(shortParamType.content.disposer)->_vptr_ArrayDisposer)
              (shortParamType.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  pBVar11 = genericResultType.name.branches.ptr;
  if (genericResultType.name.branches.ptr != (Branch *)0x0) {
    uVar2 = CONCAT44(genericResultType.name.branches.size_._4_4_,
                     (undefined4)genericResultType.name.branches.size_);
    genericResultType.name.branches.ptr = (Branch *)0x0;
    genericResultType.name.branches.size_._0_4_ = 0;
    genericResultType.name.branches.size_._4_4_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(genericResultType.name.branches.disposer._4_4_,
                         genericResultType.name.branches.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(genericResultType.name.branches.disposer._4_4_,
                        genericResultType.name.branches.disposer._0_4_),pBVar11,0x40,uVar2,uVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar10 = genericResultType.name.text.content.size_;
  pcVar24 = genericResultType.name.text.content.ptr;
  if (genericResultType.name.text.content.ptr != (char *)0x0) {
    genericResultType.name.text.content.ptr = (char *)0x0;
    genericResultType.name.text.content.size_ = 0;
    (**(genericResultType.name.text.content.disposer)->_vptr_ArrayDisposer)
              (genericResultType.name.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  pBVar11 = resultType.name.branches.ptr;
  if (resultType.name.branches.ptr != (Branch *)0x0) {
    uVar2 = CONCAT44(resultType.name.branches.size_._4_4_,(undefined4)resultType.name.branches.size_
                    );
    resultType.name.branches.ptr = (Branch *)0x0;
    resultType.name.branches.size_._0_4_ = 0;
    resultType.name.branches.size_._4_4_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(resultType.name.branches.disposer._4_4_,
                         resultType.name.branches.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(resultType.name.branches.disposer._4_4_,
                        resultType.name.branches.disposer._0_4_),pBVar11,0x40,uVar2,uVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar10 = resultType.name.text.content.size_;
  pcVar24 = resultType.name.text.content.ptr;
  if (resultType.name.text.content.ptr != (char *)0x0) {
    resultType.name.text.content.ptr = (char *)0x0;
    resultType.name.text.content.size_ = 0;
    (**(resultType.name.text.content.disposer)->_vptr_ArrayDisposer)
              (resultType.name.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  pBVar11 = genericParamType.name.branches.ptr;
  if (genericParamType.name.branches.ptr != (Branch *)0x0) {
    uVar2 = CONCAT44(genericParamType.name.branches.size_._4_4_,
                     (undefined4)genericParamType.name.branches.size_);
    genericParamType.name.branches.ptr = (Branch *)0x0;
    genericParamType.name.branches.size_._0_4_ = 0;
    genericParamType.name.branches.size_._4_4_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(genericParamType.name.branches.disposer._4_4_,
                         genericParamType.name.branches.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(genericParamType.name.branches.disposer._4_4_,
                        genericParamType.name.branches.disposer._0_4_),pBVar11,0x40,uVar2,uVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar10 = genericParamType.name.text.content.size_;
  pcVar24 = genericParamType.name.text.content.ptr;
  if (genericParamType.name.text.content.ptr != (char *)0x0) {
    genericParamType.name.text.content.ptr = (char *)0x0;
    genericParamType.name.text.content.size_ = 0;
    (**(genericParamType.name.text.content.disposer)->_vptr_ArrayDisposer)
              (genericParamType.name.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  pBVar11 = paramType.name.branches.ptr;
  if (paramType.name.branches.ptr != (Branch *)0x0) {
    uVar2 = CONCAT44(paramType.name.branches.size_._4_4_,(undefined4)paramType.name.branches.size_);
    paramType.name.branches.ptr = (Branch *)0x0;
    paramType.name.branches.size_._0_4_ = 0;
    paramType.name.branches.size_._4_4_ = 0;
    (*(code *)**(undefined8 **)
                CONCAT44(paramType.name.branches.disposer._4_4_,
                         paramType.name.branches.disposer._0_4_))
              ((undefined8 *)
               CONCAT44(paramType.name.branches.disposer._4_4_,
                        paramType.name.branches.disposer._0_4_),pBVar11,0x40,uVar2,uVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar10 = paramType.name.text.content.size_;
  pcVar24 = paramType.name.text.content.ptr;
  if (paramType.name.text.content.ptr != (char *)0x0) {
    paramType.name.text.content.ptr = (char *)0x0;
    paramType.name.text.content.size_ = 0;
    (**(paramType.name.text.content.disposer)->_vptr_ArrayDisposer)
              (paramType.name.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  sVar10 = interfaceTypeName.name.branches.size_;
  pBVar11 = interfaceTypeName.name.branches.ptr;
  if (interfaceTypeName.name.branches.ptr != (Branch *)0x0) {
    interfaceTypeName.name.branches.ptr = (Branch *)0x0;
    interfaceTypeName.name.branches.size_ = 0;
    (**(interfaceTypeName.name.branches.disposer)->_vptr_ArrayDisposer)
              (interfaceTypeName.name.branches.disposer,pBVar11,0x40,sVar10,sVar10,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar10 = interfaceTypeName.name.text.content.size_;
  pcVar24 = interfaceTypeName.name.text.content.ptr;
  if (interfaceTypeName.name.text.content.ptr != (char *)0x0) {
    interfaceTypeName.name.text.content.ptr = (char *)0x0;
    interfaceTypeName.name.text.content.size_ = 0;
    (**(interfaceTypeName.name.text.content.disposer)->_vptr_ArrayDisposer)
              (interfaceTypeName.name.text.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  if (implicitParamsTemplateDecl.content.ptr != (char *)0x0) {
    (**(implicitParamsTemplateDecl.content.disposer)->_vptr_ArrayDisposer)
              (implicitParamsTemplateDecl.content.disposer,implicitParamsTemplateDecl.content.ptr,1,
               implicitParamsTemplateDecl.content.size_,implicitParamsTemplateDecl.content.size_,0);
  }
  if (pCVar5 != (CppTypeName *)0x0) {
    (**pAVar7->_vptr_ArrayDisposer)
              (pAVar7,pCVar5,0x40,pCVar20,pCVar20,
               kj::ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::
               destruct);
  }
  pCVar20 = implicitParamsBuilder.endPtr;
  pRVar6 = implicitParamsBuilder.pos;
  pCVar5 = implicitParamsBuilder.ptr;
  if (implicitParamsBuilder.ptr != (CppTypeName *)0x0) {
    implicitParamsBuilder.ptr = (CppTypeName *)0x0;
    implicitParamsBuilder.pos = (RemoveConst<capnp::(anonymous_namespace)::CppTypeName> *)0x0;
    implicitParamsBuilder.endPtr = (CppTypeName *)0x0;
    (**(implicitParamsBuilder.disposer)->_vptr_ArrayDisposer)
              (implicitParamsBuilder.disposer,pCVar5,0x40,(long)pRVar6 - (long)pCVar5 >> 6,
               (long)pCVar20 - (long)pCVar5 >> 6,
               kj::ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::
               destruct);
  }
  sVar10 = identifierName.content.size_;
  pcVar24 = identifierName.content.ptr;
  if (identifierName.content.ptr != (char *)0x0) {
    identifierName.content.ptr = (char *)0x0;
    identifierName.content.size_ = 0;
    (**(identifierName.content.disposer)->_vptr_ArrayDisposer)
              (identifierName.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  sVar10 = titleCase.content.size_;
  pcVar24 = titleCase.content.ptr;
  if (titleCase.content.ptr != (char *)0x0) {
    titleCase.content.ptr = (char *)0x0;
    titleCase.content.size_ = 0;
    (**(titleCase.content.disposer)->_vptr_ArrayDisposer)
              (titleCase.content.disposer,pcVar24,1,sVar10,sVar10,0);
  }
  return pMVar8;
}

Assistant:

MethodText makeMethodText(kj::StringPtr interfaceName, InterfaceSchema::Method method,
                            const TemplateContext& templateContext) {
    auto proto = method.getProto();
    auto name = protoName(proto);
    auto titleCase = toTitleCase(name);
    auto paramSchema = method.getParamType();
    auto resultSchema = method.getResultType();
    auto identifierName = safeIdentifier(name);

    auto paramProto = paramSchema.getProto();
    auto resultProto = resultSchema.getProto();

    auto implicitParamsReader = proto.getImplicitParameters();
    auto implicitParamsBuilder = kj::heapArrayBuilder<CppTypeName>(implicitParamsReader.size());
    for (auto param: implicitParamsReader) {
      implicitParamsBuilder.add(CppTypeName::makeTemplateParam(param.getName()));
    }
    auto implicitParams = implicitParamsBuilder.finish();

    kj::String implicitParamsTemplateDecl;
    if (implicitParams.size() > 0) {
      implicitParamsTemplateDecl = kj::str(
          "template <", kj::StringTree(KJ_MAP(p, implicitParams) {
            return kj::strTree("typename ", p);
          }, ", "), ">\n");
    }


    CppTypeName interfaceTypeName = cppFullName(method.getContainingInterface(), nullptr);
    CppTypeName paramType;
    CppTypeName genericParamType;
    if (paramProto.getScopeId() == 0) {
      paramType = interfaceTypeName;
      if (implicitParams.size() == 0) {
        paramType.addMemberType(kj::str(titleCase, "Params"));
        genericParamType = paramType;
      } else {
        genericParamType = paramType;
        genericParamType.addMemberTemplate(kj::str(titleCase, "Params"), nullptr);
        paramType.addMemberTemplate(kj::str(titleCase, "Params"),
                                    kj::heapArray(implicitParams.asPtr()));
      }
    } else {
      paramType = cppFullName(paramSchema, method);
      genericParamType = cppFullName(paramSchema, nullptr);
    }
    CppTypeName resultType;
    CppTypeName genericResultType;
    if (resultProto.getScopeId() == 0) {
      resultType = interfaceTypeName;
      if (implicitParams.size() == 0) {
        resultType.addMemberType(kj::str(titleCase, "Results"));
        genericResultType = resultType;
      } else {
        genericResultType = resultType;
        genericResultType.addMemberTemplate(kj::str(titleCase, "Results"), nullptr);
        resultType.addMemberTemplate(kj::str(titleCase, "Results"),
                                     kj::heapArray(implicitParams.asPtr()));
      }
    } else {
      resultType = cppFullName(resultSchema, method);
      genericResultType = cppFullName(resultSchema, nullptr);
    }

    kj::String shortParamType = paramProto.getScopeId() == 0 ?
        kj::str(titleCase, "Params") : kj::str(genericParamType);
    kj::String shortResultType = resultProto.getScopeId() == 0 ?
        kj::str(titleCase, "Results") : kj::str(genericResultType);

    auto interfaceProto = method.getContainingInterface().getProto();
    uint64_t interfaceId = interfaceProto.getId();
    auto interfaceIdHex = kj::hex(interfaceId);
    uint16_t methodId = method.getIndex();

    // TODO(msvc):  Notice that the return type of this method's request function is supposed to be
    // `::capnp::Request<param, result>`. If the first template parameter to ::capnp::Request is a
    // template instantiation, MSVC will sometimes complain that it's unspecialized and can't be
    // used as a parameter in the return type (error C3203). It is not clear to me under what exact
    // conditions this bug occurs, but it commonly crops up in test.capnp.h.
    //
    // The easiest (and only) workaround I found is to use C++14's return type deduction here, thus
    // the `CAPNP_AUTO_IF_MSVC()` hackery in the return type declarations below. We're depending on
    // the fact that that this function has an inline implementation for the deduction to work.

    auto requestMethodImpl = kj::strTree(
        templateContext.allDecls(),
        implicitParamsTemplateDecl,
        templateContext.isGeneric() ? "CAPNP_AUTO_IF_MSVC(" : "",
        "::capnp::Request<", paramType, ", ", resultType, ">",
        templateContext.isGeneric() ? ")\n" : "\n",
        interfaceName, "::Client::", name, "Request(::kj::Maybe< ::capnp::MessageSize> sizeHint) {\n"
        "  return newCall<", paramType, ", ", resultType, ">(\n"
        "      0x", interfaceIdHex, "ull, ", methodId, ", sizeHint);\n"
        "}\n");

    return MethodText {
      kj::strTree(
          implicitParamsTemplateDecl.size() == 0 ? "" : "  ", implicitParamsTemplateDecl,
          templateContext.isGeneric() ? "  CAPNP_AUTO_IF_MSVC(" : "  ",
          "::capnp::Request<", paramType, ", ", resultType, ">",
          templateContext.isGeneric() ? ")" : "",
          " ", name, "Request(\n"
          "      ::kj::Maybe< ::capnp::MessageSize> sizeHint = nullptr);\n"),

      kj::strTree(
          paramProto.getScopeId() != 0 ? kj::strTree() : kj::strTree(
              "  typedef ", genericParamType, " ", titleCase, "Params;\n"),
          resultProto.getScopeId() != 0 ? kj::strTree() : kj::strTree(
              "  typedef ", genericResultType, " ", titleCase, "Results;\n"),
          "  typedef ::capnp::CallContext<", shortParamType, ", ", shortResultType, "> ",
                titleCase, "Context;\n"
          "  virtual ::kj::Promise<void> ", identifierName, "(", titleCase, "Context context);\n"),

      implicitParams.size() == 0 ? kj::strTree() : kj::mv(requestMethodImpl),

      kj::strTree(
          implicitParams.size() == 0 ? kj::mv(requestMethodImpl) : kj::strTree(),
          templateContext.allDecls(),
          "::kj::Promise<void> ", interfaceName, "::Server::", identifierName, "(", titleCase, "Context) {\n"
          "  return ::capnp::Capability::Server::internalUnimplemented(\n"
          "      \"", interfaceProto.getDisplayName(), "\", \"", name, "\",\n"
          "      0x", interfaceIdHex, "ull, ", methodId, ");\n"
          "}\n"),

      kj::strTree(
          "    case ", methodId, ":\n"
          "      return ", identifierName, "(::capnp::Capability::Server::internalGetTypedContext<\n"
          "          ", genericParamType, ", ", genericResultType, ">(context));\n")
    };
  }